

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall Diligent::GLContextState::SetColorWriteMask(GLContextState *this,Uint32 WriteMask)

{
  bool bVar1;
  Char *Message;
  ulong local_50;
  size_t rt;
  undefined1 local_38 [8];
  string msg;
  GLenum err;
  Uint32 WriteMask_local;
  GLContextState *this_local;
  
  msg.field_2._12_4_ = WriteMask;
  bVar1 = EnableStateHelper::operator_cast_to_bool(&this->m_bIndexedWriteMasks);
  if ((bVar1) || (this->m_ColorWriteMasks[0] != msg.field_2._12_4_)) {
    glColorMask((msg.field_2._12_4_ & 1) != 0,(msg.field_2._12_4_ & 2) != 0,
                (msg.field_2._12_4_ & 4) != 0,(msg.field_2._12_4_ & 8) != 0);
    msg.field_2._8_4_ = glGetError();
    if (msg.field_2._8_4_ != 0) {
      LogError<false,char[28],char[17],unsigned_int>
                (false,"SetColorWriteMask",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x366,(char (*) [28])"Failed to set GL color mask",
                 (char (*) [17])"\nGL Error Code: ",(uint *)(msg.field_2._M_local_buf + 8));
      FormatString<char[6]>((string *)local_38,(char (*) [6])0xe8e72e);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SetColorWriteMask",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x366);
      std::__cxx11::string::~string((string *)local_38);
    }
    for (local_50 = 0; local_50 < 8; local_50 = local_50 + 1) {
      this->m_ColorWriteMasks[local_50] = msg.field_2._12_4_;
    }
    EnableStateHelper::operator=(&this->m_bIndexedWriteMasks,false);
  }
  return;
}

Assistant:

void GLContextState::SetColorWriteMask(Uint32 WriteMask)
{
    // Even though the write mask only applies to writes to a framebuffer, the mask state is NOT
    // Framebuffer state. So it is NOT part of a Framebuffer Object or the Default Framebuffer.
    // Binding a new framebuffer will NOT affect the mask.
    if (!m_bIndexedWriteMasks && m_ColorWriteMasks[0] == WriteMask)
        return;

    // glColorMask() sets the mask for ALL draw buffers
    glColorMask(
        (WriteMask & COLOR_MASK_RED) ? GL_TRUE : GL_FALSE,
        (WriteMask & COLOR_MASK_GREEN) ? GL_TRUE : GL_FALSE,
        (WriteMask & COLOR_MASK_BLUE) ? GL_TRUE : GL_FALSE,
        (WriteMask & COLOR_MASK_ALPHA) ? GL_TRUE : GL_FALSE);
    DEV_CHECK_GL_ERROR("Failed to set GL color mask");

    for (size_t rt = 0; rt < _countof(m_ColorWriteMasks); ++rt)
        m_ColorWriteMasks[rt] = WriteMask;

    m_bIndexedWriteMasks = false;
}